

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

wchar_t quests_count(void)

{
  wchar_t wVar1;
  quest *pqVar2;
  
  wVar1 = L'\0';
  for (pqVar2 = quests; pqVar2 != (quest *)0x0; pqVar2 = pqVar2->next) {
    wVar1 = wVar1 + (uint)pqVar2->complete;
  }
  return wVar1;
}

Assistant:

int quests_count(void)
{
	struct quest *quest = quests;
	int num = 0;
	while (quest) {
		if (quest->complete) {
			num++;
		}
		quest = quest->next;
	}
	return num;
}